

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void clearbyvalues(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  GCObject *o;
  GCObject *pGVar5;
  Node *n;
  long lVar6;
  
  do {
    if (l == f) {
      return;
    }
    if (l->tt != '\x05') {
      __assert_fail("(l)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x33f,"void clearbyvalues(global_State *, GCObject *, GCObject *)");
    }
    lVar2 = *(long *)&l[1].tt;
    bVar1 = l->field_0xb;
    lVar6 = 8;
    for (uVar4 = 0; uVar4 < *(uint *)&l->field_0xc; uVar4 = uVar4 + 1) {
      pGVar5 = l[1].next;
      if (*(short *)((long)&pGVar5->next + lVar6) < 0) {
        o = *(GCObject **)((long)pGVar5 + lVar6 + -8);
      }
      else {
        o = (GCObject *)0x0;
      }
      iVar3 = iscleared(g,o);
      if (iVar3 != 0) {
        *(undefined2 *)((long)&pGVar5->next + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    }
    for (n = *(Node **)&l[1].tt; n < (Node *)(lVar2 + (long)(1 << (bVar1 & 0x1f)) * 0x20); n = n + 1
        ) {
      if ((short)(n->i_val).tt_ < 0) {
        pGVar5 = (n->i_val).value_.gc;
      }
      else {
        pGVar5 = (GCObject *)0x0;
      }
      iVar3 = iscleared(g,pGVar5);
      if (iVar3 == 0) {
        if ((n->i_val).tt_ == 0) goto LAB_0012d102;
      }
      else {
        (n->i_val).tt_ = 0;
LAB_0012d102:
        removeentry(n);
      }
    }
    if (l->tt != '\x05') {
      __assert_fail("(l)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x33e,"void clearbyvalues(global_State *, GCObject *, GCObject *)");
    }
    l = l[3].next;
  } while( true );
}

Assistant:

static void clearbyvalues (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    unsigned int i;
    for (i = 0; i < h->sizearray; i++) {
      TValue *o = &h->array[i];
      if (iscleared(g, gcvalueN(o)))  /* value was collected? */
        setnilvalue(o);  /* remove value */
    }
    for (n = gnode(h, 0); n < limit; n++) {
      if (iscleared(g, gcvalueN(gval(n))))
        setnilvalue(gval(n));  /* remove value ... */
      if (ttisnil(gval(n))) 
        removeentry(n);  /* and remove entry from table */
    }
  }
}